

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O3

FT_Error FT_Stroker_New(FT_Library library,FT_Stroker *astroker)

{
  FT_Memory memory;
  FT_Stroker pFVar1;
  int local_2c [2];
  FT_Error error;
  
  if (library != (FT_Library)0x0) {
    if (astroker == (FT_Stroker *)0x0) {
      local_2c[0] = 6;
    }
    else {
      memory = library->memory;
      pFVar1 = (FT_Stroker)ft_mem_alloc(memory,0xd8,local_2c);
      if (local_2c[0] == 0) {
        pFVar1->library = library;
        pFVar1->borders[0].memory = memory;
        pFVar1->borders[0].num_points = 0;
        pFVar1->borders[0].max_points = 0;
        pFVar1->borders[0].points = (FT_Vector *)0x0;
        pFVar1->borders[0].tags = (FT_Byte *)0x0;
        pFVar1->borders[0].start = -1;
        pFVar1->borders[0].valid = '\0';
        pFVar1->borders[1].memory = memory;
        pFVar1->borders[1].num_points = 0;
        pFVar1->borders[1].max_points = 0;
        pFVar1->borders[1].points = (FT_Vector *)0x0;
        pFVar1->borders[1].tags = (FT_Byte *)0x0;
        pFVar1->borders[1].start = -1;
        pFVar1->borders[1].valid = '\0';
      }
      *astroker = pFVar1;
    }
    return local_2c[0];
  }
  return 0x21;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_New( FT_Library   library,
                  FT_Stroker  *astroker )
  {
    FT_Error    error;           /* assigned in FT_NEW */
    FT_Memory   memory;
    FT_Stroker  stroker = NULL;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !astroker )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !FT_NEW( stroker ) )
    {
      stroker->library = library;

      ft_stroke_border_init( &stroker->borders[0], memory );
      ft_stroke_border_init( &stroker->borders[1], memory );
    }

    *astroker = stroker;

    return error;
  }